

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O3

void __thiscall
hwtest::pgraph::MthdKelvinFdBeginTransitionA::emulate_mthd(MthdKelvinFdBeginTransitionA *this)

{
  pgraph_state *state;
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type != 0x20) {
    nv04_pgraph_missing_hw(state);
    return;
  }
  if ((((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 8) != 0) &&
     (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_fd_check_skip & 0x100)
      == 0)) {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc;
    if ((uVar1 & 0x10) == 0) {
      nv04_pgraph_blowup(state,0x80000);
      uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc;
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      nv04_pgraph_blowup(state,0x80000);
      uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc;
    }
    if ((short)uVar1 < 0) {
      nv04_pgraph_blowup(state,0x80000);
      uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc;
    }
    if ((uVar1 >> 0x10 & 1) == 0) {
      nv04_pgraph_blowup(state,0x80000);
      uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc;
    }
    if ((uVar1 >> 0x18 & 1) != 0) {
      nv04_pgraph_blowup(state,0x80000);
    }
  }
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc;
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc = uVar1 | 0x1000000;
    return;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc =
       uVar1 & 0xfeffefff | 0x1000;
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_shadow_begin_transition_a =
       uVar1;
  uVar2 = 0;
  lVar3 = 0x38;
  do {
    uVar2 = (uVar2 + 1) - (uint)(((ulong)uVar1 << ((byte)lVar3 & 0x3f)) >> 0x3c == 0);
    lVar3 = lVar3 + -4;
  } while (lVar3 != 0x1c);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_state_transition =
       (uVar2 & 0xf) << 0x18 |
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_state_transition &
       0xf0ffffff;
  pgraph_fd_cmd(state,0x2800,uVar1);
  return;
}

Assistant:

void emulate_mthd() override {
		if (chipset.card_type != 0x20) {
			nv04_pgraph_missing_hw(&exp);
			return;
		}
		if (extr(exp.debug_d, 3, 1) && !extr(exp.debug_fd_check_skip, 8, 1)) {
			if (!extr(exp.fe3d_misc, 4, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
			if (extr(exp.fe3d_misc, 12, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
			if (extr(exp.fe3d_misc, 15, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
			if (!extr(exp.fe3d_misc, 16, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
			if (extr(exp.fe3d_misc, 24, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
		}
		if (!exp.nsource) {
			insrt(exp.fe3d_misc, 24, 1, 0);
			insrt(exp.fe3d_misc, 12, 1, 1);
			exp.fe3d_shadow_begin_transition_a = val;
			int ctr = 0;
			for (int i = 1; i < 8; i++)
				if (extr(val, i * 4, 4))
					ctr++;
			insrt(exp.fe3d_state_transition, 24, 4, ctr);
			pgraph_fd_cmd(&exp, 0x2800, val);
		} else {
			insrt(exp.fe3d_misc, 24, 1, 1);
		}
	}